

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Position * __thiscall pfederc::Lexer::getCurrentCursor(Position *__return_storage_ptr__,Lexer *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = this->currentStartIndex;
  sVar2 = 0;
  if (this->currentEndIndex != 0) {
    sVar2 = this->currentEndIndex - 1;
  }
  __return_storage_ptr__->line =
       ((long)(this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  __return_storage_ptr__->startIndex = sVar1;
  __return_storage_ptr__->endIndex = sVar2;
  return __return_storage_ptr__;
}

Assistant:

Position Lexer::getCurrentCursor() const noexcept {
  return Position(lineIndices.size() - 1, currentStartIndex,
    currentEndIndex > 0 ? currentEndIndex - 1 : 0);
}